

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderDerivateTests.cpp
# Opt level: O1

Vec4 __thiscall
vkt::sr::anon_unknown_0::TriangleDerivateCaseInstance::getSurfaceThreshold
          (TriangleDerivateCaseInstance *this)

{
  undefined1 auVar1 [16];
  Vector<float,_4> *res_1;
  int i;
  long lVar2;
  undefined8 *in_RDI;
  ulong in_XMM1_Qa;
  Vec4 VVar3;
  Vector<float,_4> res;
  int aiStack_10 [4];
  
  if (this->m_definitions->surfaceType != SURFACETYPE_UNORM_FBO) {
    *in_RDI = 0;
    in_RDI[1] = 0;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = in_XMM1_Qa;
    return (float  [4])(auVar1 << 0x40);
  }
  lVar2 = 0;
  do {
    aiStack_10[lVar2] = 1;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  res.m_data[0] = 0.0;
  res.m_data[1] = 0.0;
  res.m_data[2] = 0.0;
  res.m_data[3] = 0.0;
  lVar2 = 0;
  do {
    res.m_data[lVar2] = (float)aiStack_10[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  *in_RDI = 0;
  in_RDI[1] = 0;
  lVar2 = 0;
  do {
    VVar3.m_data[2] = res.m_data[lVar2] / 255.0;
    *(float *)((long)in_RDI + lVar2 * 4) = VVar3.m_data[2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  VVar3.m_data[0] = 255.0;
  VVar3.m_data[1] = 0.0;
  VVar3.m_data[3] = 0.0;
  return (Vec4)VVar3.m_data;
}

Assistant:

tcu::Vec4 TriangleDerivateCaseInstance::getSurfaceThreshold (void) const
{
	switch (m_definitions.surfaceType)
	{
		case SURFACETYPE_UNORM_FBO:				return tcu::IVec4(1).asFloat() / 255.0f;
		case SURFACETYPE_FLOAT_FBO:				return tcu::Vec4(0.0f);
		default:
			DE_ASSERT(false);
			return tcu::Vec4(0.0f);
	}
}